

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O0

void rrot1(void *blob,int len,int c)

{
  int len_00;
  uint32_t uVar1;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  uint32_t bit;
  int i;
  int nbits;
  uint32_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int c_00;
  
  len_00 = in_ESI << 3;
  for (c_00 = 0; c_00 < in_EDX; c_00 = c_00 + 1) {
    uVar1 = getbit(in_RDI,in_ESI,0);
    rshift1((void *)CONCAT44(in_ESI,in_EDX),len_00,c_00);
    setbit((void *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
           in_stack_ffffffffffffffd8,0);
  }
  return;
}

Assistant:

void rrot1 ( void * blob, int len, int c )
{
  int nbits = len * 8;

  for(int i = 0; i < c; i++)
  {
    uint32_t bit = getbit(blob,len,0);

    rshift1(blob,len,1);

    setbit(blob,len,nbits-1,bit);
  }
}